

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char sqlite3CompareAffinity(Expr *pExpr,char aff2)

{
  byte bVar1;
  char aff1;
  char aff2_local;
  Expr *pExpr_local;
  
  bVar1 = sqlite3ExprAffinity(pExpr);
  if (((char)bVar1 < 'A') || (aff2 < 'A')) {
    if ((char)bVar1 < 'A') {
      bVar1 = aff2;
    }
    pExpr_local._7_1_ = bVar1 | 0x40;
  }
  else if (((char)bVar1 < 'C') && (aff2 < 'C')) {
    pExpr_local._7_1_ = 0x41;
  }
  else {
    pExpr_local._7_1_ = 0x43;
  }
  return pExpr_local._7_1_;
}

Assistant:

SQLITE_PRIVATE char sqlite3CompareAffinity(const Expr *pExpr, char aff2){
  char aff1 = sqlite3ExprAffinity(pExpr);
  if( aff1>SQLITE_AFF_NONE && aff2>SQLITE_AFF_NONE ){
    /* Both sides of the comparison are columns. If one has numeric
    ** affinity, use that. Otherwise use no affinity.
    */
    if( sqlite3IsNumericAffinity(aff1) || sqlite3IsNumericAffinity(aff2) ){
      return SQLITE_AFF_NUMERIC;
    }else{
      return SQLITE_AFF_BLOB;
    }
  }else{
    /* One side is a column, the other is not. Use the columns affinity. */
    assert( aff1<=SQLITE_AFF_NONE || aff2<=SQLITE_AFF_NONE );
    return (aff1<=SQLITE_AFF_NONE ? aff2 : aff1) | SQLITE_AFF_NONE;
  }
}